

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

GenFuncs<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
* vkt::shaderexecutor::makeVectorizedFuncs<vkt::shaderexecutor::Functions::Add>(void)

{
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *pFVar1;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
  *pGVar2;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
  *pGVar3;
  GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
  *pGVar4;
  GenFuncs<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *in_RDI;
  
  pFVar1 = (Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *)instance<vkt::shaderexecutor::Functions::Add>();
  pGVar2 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Add,2>>()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
  ;
  pGVar3 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Add,3>>()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_3>
  ;
  pGVar4 = &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Add,4>>()->
            super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_4>
  ;
  in_RDI->func = pFVar1;
  in_RDI->func2 = pGVar2;
  in_RDI->func3 = pGVar3;
  in_RDI->func4 = pGVar4;
  return in_RDI;
}

Assistant:

GenFuncs<typename F::Sig> makeVectorizedFuncs (void)
{
	return GenFuncs<typename F::Sig>(instance<F>(),
									 instance<VectorizedFunc<F, 2> >(),
									 instance<VectorizedFunc<F, 3> >(),
									 instance<VectorizedFunc<F, 4> >());
}